

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O3

void __thiscall Memory::CacheAllocator::ZeroAll(CacheAllocator *this)

{
  ArenaMemoryBlock *pAVar1;
  ArenaMemoryBlock *pAVar2;
  char *pcVar3;
  BigBlock *pBVar4;
  
  pBVar4 = (this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
           super_ArenaData.bigBlocks;
  if (pBVar4 != (BigBlock *)0x0) {
    pcVar3 = (this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
             super_ArenaData.cacheBlockCurrent + (-0x20 - (long)pBVar4);
    if (pcVar3 == (char *)pBVar4->currentByte) goto LAB_0069500e;
    pBVar4->currentByte = (size_t)pcVar3;
    for (pBVar4 = (this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>
                  ).super_ArenaData.bigBlocks; pBVar4 != (BigBlock *)0x0;
        pBVar4 = (pBVar4->super_ArenaMemoryBlock).field_0.nextBigBlock) {
LAB_0069500e:
      memset(pBVar4 + 1,0,pBVar4->currentByte);
    }
  }
  for (pBVar4 = (this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
                super_ArenaData.fullBlocks; pBVar4 != (BigBlock *)0x0;
      pBVar4 = (pBVar4->super_ArenaMemoryBlock).field_0.nextBigBlock) {
    memset(pBVar4 + 1,0,pBVar4->currentByte);
  }
  pAVar2 = (this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
           super_ArenaData.mallocBlocks;
  while (pAVar2 != (ArenaMemoryBlock *)0x0) {
    pAVar1 = (pAVar2->field_0).next;
    memset(pAVar2 + 1,0,pAVar2->nbytes);
    pAVar2 = pAVar1;
  }
  return;
}

Assistant:

void CacheAllocator::ZeroAll()
{
    UpdateCacheBlock();
    BigBlock *blockp = this->bigBlocks;
    while (blockp != NULL)
    {
        memset(blockp->GetBytes(), 0, blockp->currentByte);
        blockp = blockp->nextBigBlock;
    }
    blockp = this->fullBlocks;
    while (blockp != NULL)
    {
        memset(blockp->GetBytes(), 0, blockp->currentByte);
        blockp = blockp->nextBigBlock;
    }

    ArenaMemoryBlock * memoryBlock = this->mallocBlocks;
    while (memoryBlock != nullptr)
    {
        ArenaMemoryBlock * next = memoryBlock->next;
        memset(memoryBlock->GetBytes(), 0, memoryBlock->nbytes);
        memoryBlock = next;
    }
}